

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLElement * __thiscall tinyxml2::XMLDocument::NewElement(XMLDocument *this,char *name)

{
  XMLDocument *doc;
  XMLElement *in_RDI;
  MemPoolT<104> *unaff_retaddr;
  XMLElement *ele;
  
  doc = (XMLDocument *)MemPoolT<104>::Alloc(unaff_retaddr);
  XMLElement::XMLElement(in_RDI,doc);
  (doc->super_XMLNode)._memPool = (MemPool *)&in_RDI[1].super_XMLNode._value;
  XMLElement::SetName(in_RDI,(char *)doc,false);
  return (XMLElement *)doc;
}

Assistant:

XMLElement* XMLDocument::NewElement( const char* name )
{
    TIXMLASSERT( sizeof( XMLElement ) == _elementPool.ItemSize() );
    XMLElement* ele = new (_elementPool.Alloc()) XMLElement( this );
    ele->_memPool = &_elementPool;
    ele->SetName( name );
    return ele;
}